

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sql_statement.hpp
# Opt level: O3

void __thiscall duckdb::SQLStatement::SQLStatement(SQLStatement *this,SQLStatement *other)

{
  pointer pcVar1;
  idx_t iVar2;
  size_t sVar3;
  undefined7 uVar4;
  undefined4 uVar5;
  __alloc_node_gen_t __alloc_node_gen;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>_>_>
  local_20;
  
  this->_vptr_SQLStatement = (_func_int **)&PTR__SQLStatement_024364f0;
  uVar4 = *(undefined7 *)&other->field_0x9;
  iVar2 = other->stmt_location;
  this->type = other->type;
  *(undefined7 *)&this->field_0x9 = uVar4;
  this->stmt_location = iVar2;
  this->stmt_length = other->stmt_length;
  local_20._M_h = (__hashtable_alloc *)&this->named_param_map;
  (this->named_param_map)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->named_param_map)._M_h._M_bucket_count = (other->named_param_map)._M_h._M_bucket_count;
  (this->named_param_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->named_param_map)._M_h._M_element_count = (other->named_param_map)._M_h._M_element_count;
  uVar5 = *(undefined4 *)&(other->named_param_map)._M_h._M_rehash_policy.field_0x4;
  sVar3 = (other->named_param_map)._M_h._M_rehash_policy._M_next_resize;
  (this->named_param_map)._M_h._M_rehash_policy._M_max_load_factor =
       (other->named_param_map)._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->named_param_map)._M_h._M_rehash_policy.field_0x4 = uVar5;
  (this->named_param_map)._M_h._M_rehash_policy._M_next_resize = sVar3;
  (this->named_param_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,unsigned_long>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_20._M_h,&(other->named_param_map)._M_h,&local_20);
  (this->query)._M_dataplus._M_p = (pointer)&(this->query).field_2;
  pcVar1 = (other->query)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->query,pcVar1,pcVar1 + (other->query)._M_string_length);
  return;
}

Assistant:

SQLStatement(const SQLStatement &other) = default;